

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeNF
          (ChElementHexaANCF_3843 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  XprTypeNested pMVar7;
  scalar_constant_op<double> sVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  long index;
  uint i;
  long index_00;
  Scalar SVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVectorN<double,_3> M_scaled;
  ChMatrix33<double> J_Cxi_Inv;
  Map<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  ChMatrix33<double> J_Cxi;
  VectorN G_B;
  VectorN G_C;
  VectorN G_A;
  VectorN Sxi_compact;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  MatrixNx3 QiCompact;
  undefined1 local_11f0 [16];
  XprTypeNested pMStack_11e0;
  variable_if_dynamic<long,__1> vStack_11d8;
  variable_if_dynamic<long,__1> vStack_11d0;
  long lStack_11c8;
  Index IStack_11c0;
  scalar_constant_op<double> local_11b8;
  Matrix<double,_3,_3,_1,_3,_3> local_11a8;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_1160;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_1120;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_10e0;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_10a0;
  undefined1 local_1068 [16];
  XprTypeNested pMStack_1058;
  variable_if_dynamic<long,__1> vStack_1050;
  variable_if_dynamic<long,__1> vStack_1048;
  long lStack_1040;
  double dStack_1038;
  scalar_constant_op<double> local_1030;
  undefined1 local_1020 [16];
  XprTypeNested pMStack_1010;
  variable_if_dynamic<long,__1> vStack_1008;
  variable_if_dynamic<long,__1> vStack_1000;
  Index IStack_ff8;
  long lStack_ff0;
  PointerType local_fe0;
  XprTypeNested pMStack_fd8;
  XprTypeNested pMStack_fd0;
  XprTypeNested pMStack_fc8;
  long lStack_fc0;
  Index IStack_fb8;
  double dStack_fb0;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_fa0;
  Matrix<double,_32,_3,_1,_32,_3> *local_f60 [2];
  undefined1 local_f50 [16];
  XprTypeNested pMStack_f40;
  variable_if_dynamic<long,__1> vStack_f38;
  variable_if_dynamic<long,__1> vStack_f30;
  double dStack_f28;
  scalar_constant_op<double> local_f18;
  Matrix<double,_3,_3,_1,_3,_3> local_f08;
  Matrix<double,_3,_3,_1,_3,_3> *local_ec0 [2];
  XprTypeNested pMStack_eb0;
  XprTypeNested pMStack_ea8;
  XprTypeNested local_ea0;
  Index IStack_e98;
  long lStack_e90;
  Index IStack_e88;
  double local_e78;
  XprTypeNested local_e68;
  XprTypeNested pMStack_e60;
  XprTypeNested pMStack_e58;
  Index IStack_e50;
  long lStack_e48;
  double dStack_e40;
  double local_e30;
  XprTypeNested local_e18;
  double dStack_e10;
  XprTypeNested pMStack_e08;
  Index IStack_e00;
  long lStack_df8;
  double dStack_df0;
  double local_de0;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_da8;
  undefined1 local_d78 [24];
  scalar_constant_op<double> sStack_d60;
  variable_if_dynamic<long,__1> local_d58;
  variable_if_dynamic<long,__1> vStack_d50;
  long lStack_d48;
  scalar_constant_op<double> sStack_d40;
  double local_d30;
  PointerType local_d20;
  XprTypeNested pMStack_d18;
  double dStack_d10;
  long lStack_d08;
  Index IStack_d00;
  long lStack_cf8;
  double local_ce8;
  PointerType local_cd0;
  XprTypeNested pMStack_cc8;
  XprTypeNested pMStack_cc0;
  XprTypeNested pMStack_cb8;
  Index IStack_cb0;
  long lStack_ca8;
  double local_c98;
  undefined1 local_c80 [16];
  XprTypeNested pMStack_c70;
  variable_if_dynamic<long,__1> vStack_c68;
  variable_if_dynamic<long,__1> vStack_c60;
  Index IStack_c58;
  long lStack_c50;
  scalar_constant_op<double> sStack_c48;
  double local_c38;
  XprTypeNested local_c28;
  double dStack_c20;
  XprTypeNested pMStack_c18;
  Index IStack_c10;
  long lStack_c08;
  double dStack_c00;
  double local_bf0;
  PointerType local_bd8;
  XprTypeNested pMStack_bd0;
  XprTypeNested pMStack_bc8;
  XprTypeNested pMStack_bc0;
  Index IStack_bb8;
  long lStack_bb0;
  double local_ba0;
  Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_b80;
  MatrixNx3c *local_b78;
  VectorN local_a80;
  MatrixNx3c local_980;
  undefined1 local_680 [32];
  XprTypeNested local_660;
  variable_if_dynamic<long,__1> vStack_658;
  double dStack_650;
  double dStack_648;
  Matrix<double,_32,_3,_1,_32,_3> local_380;
  
  Calc_Sxi_compact(this,&local_a80,xi,eta,zeta);
  index = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_980,F,0,3);
  local_680._0_8_ = &local_a80;
  vStack_658.m_value =
       (long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
             m_data.array[4];
  dStack_650 = local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
               m_data.array[5];
  dStack_648 = local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
               m_data.array[6];
  local_680._8_8_ =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.
       array[0];
  local_680._16_8_ =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.
       array[1];
  local_680._24_8_ =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.
       array[2];
  local_660 = (XprTypeNested)
              local_980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
              m_data.array[3];
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,32,3,1,32,3>,Eigen::Product<Eigen::Matrix<double,32,1,0,32,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
            (&local_380,
             (Product<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
              *)local_680);
  local_f60[0] = &local_380;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,96,1,0,96,1>,0,Eigen::Stride<0,0>>>
            (Qi,(Map<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_0,_Eigen::Stride<0,_0>_> *)local_f60);
  CalcCoordMatrix(this,(Matrix3xN *)local_680);
  Calc_Sxi_D(this,&local_980,xi,eta,zeta);
  local_ec0[0] = &local_f08;
  local_b80.m_xpr = (XprTypeNested)local_680;
  local_b78 = &local_980;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_ec0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_3,_0,_32,_3>,_0>_>
              *)&local_b80);
  local_b80.m_xpr = &local_f08;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_11a8,&local_b80);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> *)
                  local_1020,&local_980,0);
  lStack_fc0 = vStack_1000.m_value;
  IStack_fb8 = IStack_ff8;
  local_fe0 = (PointerType)local_1020._0_8_;
  pMStack_fd8 = (XprTypeNested)local_1020._8_8_;
  pMStack_fd0 = pMStack_1010;
  pMStack_fc8 = (XprTypeNested)vStack_1008.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_c80,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_fe0,(double *)&local_11a8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_10e0,&local_980,1);
  local_10a0.m_startCol.m_value = local_10e0.m_startCol.m_value;
  local_10a0.m_outerStride = local_10e0.m_outerStride;
  local_10a0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_10e0.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_10a0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_10e0.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_10a0.m_xpr = local_10e0.m_xpr;
  local_10a0.m_startRow.m_value = local_10e0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_d78,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_10a0,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 3);
  sVar8.m_other = sStack_d40.m_other;
  lStack_11c8 = vStack_c60.m_value;
  IStack_11c0 = IStack_c58;
  local_11f0._8_8_ = local_c80._0_8_;
  pMStack_11e0 = (XprTypeNested)local_c80._8_8_;
  vStack_11d8.m_value = (long)pMStack_c70;
  vStack_11d0.m_value = vStack_c68.m_value;
  local_1068._8_8_ = local_d78._0_8_;
  pMStack_1058 = (XprTypeNested)local_d78._8_8_;
  vStack_1050.m_value = local_d78._16_8_;
  vStack_1048.m_value = (long)sStack_d60.m_other;
  lStack_1040 = local_d58.m_value;
  dStack_1038 = (double)vStack_d50.m_value;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_1160,&local_980,2);
  local_1120.m_startCol.m_value = local_1160.m_startCol.m_value;
  local_1120.m_outerStride = local_1160.m_outerStride;
  local_1120.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_1160.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_1120.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_1160.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_1120.m_xpr = local_1160.m_xpr;
  local_1120.m_startRow.m_value = local_1160.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_f50,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_1120,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 6);
  lStack_e90 = lStack_11c8;
  IStack_e88 = IStack_11c0;
  pMStack_eb0 = (XprTypeNested)local_11f0._8_8_;
  pMStack_ea8 = pMStack_11e0;
  local_ea0 = (XprTypeNested)vStack_11d8.m_value;
  IStack_e98 = vStack_11d0.m_value;
  local_e78 = sStack_c48.m_other;
  local_e68 = (XprTypeNested)local_1068._8_8_;
  pMStack_e60 = pMStack_1058;
  pMStack_e58 = (XprTypeNested)vStack_1050.m_value;
  IStack_e50 = vStack_1048.m_value;
  lStack_e48 = lStack_1040;
  dStack_e40 = dStack_1038;
  local_e30 = sVar8.m_other;
  local_e18 = (XprTypeNested)local_f50._0_8_;
  dStack_e10 = (double)local_f50._8_8_;
  pMStack_e08 = pMStack_f40;
  IStack_e00 = vStack_f38.m_value;
  lStack_df8 = vStack_f30.m_value;
  dStack_df0 = dStack_f28;
  local_de0 = local_f18.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_b80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>_>_>
              *)local_ec0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_10a0,&local_980,0);
  vStack_1000.m_value = local_10a0.m_startCol.m_value;
  IStack_ff8 = local_10a0.m_outerStride;
  local_1020._0_8_ =
       local_10a0.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_1020._8_8_ =
       local_10a0.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  pMStack_1010 = local_10a0.m_xpr;
  vStack_1008.m_value = local_10a0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_d78,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)local_1020,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_1120,&local_980,1);
  local_10e0.m_startCol.m_value = local_1120.m_startCol.m_value;
  local_10e0.m_outerStride = local_1120.m_outerStride;
  local_10e0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_1120.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_10e0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_1120.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_10e0.m_xpr = local_1120.m_xpr;
  local_10e0.m_startRow.m_value = local_1120.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_f50,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_10e0,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 4);
  sVar8.m_other = local_f18.m_other;
  lStack_1040 = local_d58.m_value;
  dStack_1038 = (double)vStack_d50.m_value;
  local_1068._8_8_ = local_d78._0_8_;
  pMStack_1058 = (XprTypeNested)local_d78._8_8_;
  vStack_1050.m_value = local_d78._16_8_;
  vStack_1048.m_value = (long)sStack_d60.m_other;
  pMStack_fd8 = (XprTypeNested)local_f50._0_8_;
  pMStack_fd0 = (XprTypeNested)local_f50._8_8_;
  pMStack_fc8 = pMStack_f40;
  lStack_fc0 = vStack_f38.m_value;
  IStack_fb8 = vStack_f30.m_value;
  dStack_fb0 = dStack_f28;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_fa0,&local_980,2);
  local_1160.m_startCol.m_value = local_fa0.m_startCol.m_value;
  local_1160.m_outerStride = local_fa0.m_outerStride;
  local_1160.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_fa0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_1160.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_fa0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_1160.m_xpr = local_fa0.m_xpr;
  local_1160.m_startRow.m_value = local_fa0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_11f0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_1160,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 7);
  lStack_c50 = lStack_1040;
  sStack_c48.m_other = dStack_1038;
  pMStack_c70 = (XprTypeNested)local_1068._8_8_;
  vStack_c68.m_value = (long)pMStack_1058;
  vStack_c60.m_value = vStack_1050.m_value;
  IStack_c58 = vStack_1048.m_value;
  local_c38 = sStack_d40.m_other;
  local_c28 = pMStack_fd8;
  dStack_c20 = (double)pMStack_fd0;
  pMStack_c18 = pMStack_fc8;
  IStack_c10 = lStack_fc0;
  lStack_c08 = IStack_fb8;
  dStack_c00 = dStack_fb0;
  local_bf0 = sVar8.m_other;
  local_bd8 = (PointerType)local_11f0._0_8_;
  pMStack_bd0 = (XprTypeNested)local_11f0._8_8_;
  pMStack_bc8 = pMStack_11e0;
  pMStack_bc0 = (XprTypeNested)vStack_11d8.m_value;
  IStack_bb8 = vStack_11d0.m_value;
  lStack_bb0 = lStack_11c8;
  local_ba0 = local_11b8.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_ec0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>_>_>
              *)local_c80);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_10e0,&local_980,0);
  local_10a0.m_startCol.m_value = local_10e0.m_startCol.m_value;
  local_10a0.m_outerStride = local_10e0.m_outerStride;
  local_10a0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_10e0.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_10a0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_10e0.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_10a0.m_xpr = local_10e0.m_xpr;
  local_10a0.m_startRow.m_value = local_10e0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_f50,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_10a0,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_1160,&local_980,1);
  local_1120.m_startCol.m_value = local_1160.m_startCol.m_value;
  local_1120.m_outerStride = local_1160.m_outerStride;
  local_1120.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_1160.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_1120.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_1160.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_1120.m_xpr = local_1160.m_xpr;
  local_1120.m_startRow.m_value = local_1160.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_11f0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_1120,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 5);
  IStack_fb8 = vStack_f30.m_value;
  dStack_fb0 = dStack_f28;
  pMStack_fd8 = (XprTypeNested)local_f50._0_8_;
  pMStack_fd0 = (XprTypeNested)local_f50._8_8_;
  pMStack_fc8 = pMStack_f40;
  lStack_fc0 = vStack_f38.m_value;
  local_1020._8_8_ = local_11f0._0_8_;
  pMStack_1010 = (XprTypeNested)local_11f0._8_8_;
  vStack_1008.m_value = (long)pMStack_11e0;
  vStack_1000.m_value = vStack_11d8.m_value;
  IStack_ff8 = vStack_11d0.m_value;
  lStack_ff0 = lStack_11c8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_da8,&local_980,2);
  local_fa0.m_startCol.m_value = local_da8.m_startCol.m_value;
  local_fa0.m_outerStride = local_da8.m_outerStride;
  local_fa0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data =
       local_da8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>.m_data;
  local_fa0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_ =
       local_da8.super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>,_0>._8_8_;
  local_fa0.m_xpr = local_da8.m_xpr;
  local_fa0.m_startRow.m_value = local_da8.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>
             *)local_1068,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>>
             *)&local_fa0,
            local_11a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array + 8);
  lStack_d48 = IStack_fb8;
  sStack_d40.m_other = dStack_fb0;
  local_d78._16_8_ = pMStack_fd8;
  sStack_d60.m_other = (double)pMStack_fd0;
  local_d58.m_value = (long)pMStack_fc8;
  vStack_d50.m_value = lStack_fc0;
  local_d30 = local_f18.m_other;
  local_d20 = (PointerType)local_1020._8_8_;
  pMStack_d18 = pMStack_1010;
  dStack_d10 = (double)vStack_1008.m_value;
  lStack_d08 = vStack_1000.m_value;
  IStack_d00 = IStack_ff8;
  lStack_cf8 = lStack_ff0;
  local_ce8 = local_11b8.m_other;
  local_cd0 = (PointerType)local_1068._0_8_;
  pMStack_cc8 = (XprTypeNested)local_1068._8_8_;
  pMStack_cc0 = pMStack_1058;
  pMStack_cb8 = (XprTypeNested)vStack_1050.m_value;
  IStack_cb0 = vStack_1048.m_value;
  lStack_ca8 = lStack_1040;
  local_c98 = local_1030.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,32,1,1,32>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_c80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_32,_1,_1,_32>_>_>_>_>
              *)local_d78);
  local_1068._0_8_ = (PointerType)0x3fe0000000000000;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f50,F,3,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)local_d78,(double *)local_1068,(StorageBaseType *)local_f50);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_11f0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)local_d78);
  for (index_00 = 0; uVar5 = local_11f0._8_8_, index_00 != 0x20; index_00 = index_00 + 1) {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1> *)local_c80,
                        index_00);
    pMVar7 = pMStack_11e0;
    SVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1> *)local_ec0,
                        index_00);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (double)pMVar7 * *pSVar9;
    auVar2 = vfmsub231sd_fma(auVar15,auVar12,auVar2);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index);
    pMVar7 = pMStack_11e0;
    *pSVar10 = auVar2._0_8_ + *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1> *)&local_b80,
                        index_00);
    uVar5 = local_11f0._0_8_;
    SVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1> *)local_c80,
                        index_00);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pMVar7;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)uVar5 * *pSVar9;
    auVar2 = vfmsub231sd_fma(auVar16,auVar13,auVar3);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 1)
    ;
    uVar5 = local_11f0._0_8_;
    *pSVar10 = auVar2._0_8_ + *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1> *)local_ec0,
                        index_00);
    uVar6 = local_11f0._8_8_;
    SVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>,_1> *)&local_b80,
                        index_00);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar5;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (double)uVar6 * *pSVar9;
    auVar2 = vfmsub231sd_fma(auVar17,auVar14,auVar4);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 2)
    ;
    index = index + 3;
    *pSVar10 = auVar2._0_8_ + *pSVar10;
  }
  SVar11 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                     (&local_f08);
  *detJ = SVar11;
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}